

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::FloatConstantTexture::ToString_abi_cxx11_(FloatConstantTexture *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<float_const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string FloatConstantTexture::ToString() const {
    return StringPrintf("[ FloatConstantTexture value: %f ]", value);
}